

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall
wasm::DataFlow::Graph::merge
          (Graph *this,
          vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          *states,Locals *out)

{
  pointer pFVar1;
  pointer pFVar2;
  size_t sVar3;
  Type TVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  pointer pFVar8;
  pointer pFVar9;
  bool bVar10;
  Index index;
  ulong uVar11;
  Node *pNVar12;
  ulong uVar13;
  FlowState *state;
  long lVar14;
  int iVar15;
  ulong uVar16;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  *__range3;
  
  pFVar1 = (states->
           super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pFVar9 = (states->
           super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (pFVar8 = pFVar9; pFVar8 != pFVar1; pFVar8 = pFVar8 + 1) {
    if ((pFVar8->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pFVar8->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("!isInUnreachable(state.locals)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                    ,0x296,"void wasm::DataFlow::Graph::merge(std::vector<FlowState> &, Locals &)");
    }
  }
  uVar16 = (ulong)((long)pFVar1 - (long)pFVar9) >> 5;
  iVar15 = (int)uVar16;
  if (iVar15 == 0) {
    if ((this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("isInUnreachable()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                    ,0x29c,"void wasm::DataFlow::Graph::merge(std::vector<FlowState> &, Locals &)");
    }
  }
  else {
    sVar3 = Function::getNumLocals(this->func);
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::resize
              (&this->locals,sVar3);
    if (iVar15 == 1) {
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::operator=
                (out,&((states->
                       super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                       )._M_impl.super__Vector_impl_data._M_start)->locals);
      return;
    }
    sVar3 = Function::getNumLocals(this->func);
    if ((int)sVar3 != 0) {
      uVar13 = 0;
      pNVar5 = (Node *)0x0;
      do {
        TVar4 = Function::getLocalType(this->func,(Index)uVar13);
        if ((TVar4.id & 0xfffffffffffffffe) == 2) {
          pFVar9 = (states->
                   super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pFVar1 = (states->
                   super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pFVar9 != pFVar1) {
            bVar10 = false;
            do {
              pFVar8 = pFVar9 + 1;
              pNVar12 = (pFVar9->locals).
                        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar13];
              if (pNVar12->type == Bad) {
                (out->
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>)
                ._M_impl.super__Vector_impl_data._M_start[uVar13] = pNVar12;
                bVar10 = true;
                break;
              }
              pFVar9 = pFVar8;
            } while (pFVar8 != pFVar1);
            if (bVar10) goto LAB_00834fac;
          }
          pFVar9 = (states->
                   super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pFVar1 = (states->
                   super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pFVar9 != pFVar1) {
            pNVar12 = (Node *)0x0;
            do {
              pNVar6 = (pFVar9->locals).
                       super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13];
              bVar10 = pNVar12 != (Node *)0x0;
              pNVar7 = pNVar6;
              if (pNVar12 == (Node *)0x0) {
LAB_00834f93:
                (out->
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>)
                ._M_impl.super__Vector_impl_data._M_start[uVar13] = pNVar6;
                pNVar12 = pNVar7;
              }
              else {
                if (pNVar6 != pNVar12) {
                  if (pNVar5 == (Node *)0x0) {
                    pNVar5 = (Node *)operator_new(0x30);
                    pNVar5->type = Block;
                    pNVar5->origin = (Expression *)0x0;
                    (pNVar5->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    (pNVar5->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    (pNVar5->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    pNVar5 = addNode(this,pNVar5);
                    lVar14 = 0x18;
                    uVar11 = 0;
                    do {
                      pNVar6 = *(Node **)((long)&(((states->
                                                  super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 locals).
                                                 super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                                 ._M_impl + lVar14);
                      if (pNVar6->type != Bad) {
                        pNVar6 = Node::makeCond(pNVar5,(Index)uVar11,pNVar6);
                        pNVar6 = addNode(this,pNVar6);
                      }
                      Node::addValue(pNVar5,pNVar6);
                      uVar11 = uVar11 + 1;
                      lVar14 = lVar14 + 0x20;
                    } while ((uVar16 & 0xffffffff) != uVar11);
                  }
                  pNVar6 = (Node *)operator_new(0x30);
                  pNVar6->type = Phi;
                  pNVar6->origin = (Expression *)0x0;
                  (pNVar6->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (pNVar6->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pNVar6->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  Node::addValue(pNVar6,pNVar5);
                  (pNVar6->field_1).index = (Index)uVar13;
                  pNVar6 = addNode(this,pNVar6);
                  pFVar2 = (states->
                           super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                  for (pFVar8 = (states->
                                super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                                )._M_impl.super__Vector_impl_data._M_start; pNVar7 = pNVar12,
                      pFVar8 != pFVar2; pFVar8 = pFVar8 + 1) {
                    pNVar7 = expandFromI1(this,(pFVar8->locals).
                                               super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar13],
                                          (Expression *)0x0);
                    Node::addValue(pNVar6,pNVar7);
                  }
                  goto LAB_00834f93;
                }
                bVar10 = false;
              }
            } while ((!bVar10) && (pFVar9 = pFVar9 + 1, pFVar9 != pFVar1));
          }
        }
LAB_00834fac:
        uVar13 = uVar13 + 1;
      } while (uVar13 != (sVar3 & 0xffffffff));
    }
  }
  return;
}

Assistant:

void merge(std::vector<FlowState>& states, Locals& out) {
    // We should only receive reachable states.
#ifndef NDEBUG
    for (auto& state : states) {
      assert(!isInUnreachable(state.locals));
    }
#endif
    Index numStates = states.size();
    if (numStates == 0) {
      // We were unreachable, and still are.
      assert(isInUnreachable());
      return;
    }
    // We may have just become reachable, if we were not before.
    setInReachable();
    // Just one thing to merge is trivial.
    if (numStates == 1) {
      out = states[0].locals;
      return;
    }
    // We create a block if we need one.
    Index numLocals = func->getNumLocals();
    Node* block = nullptr;
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      // Process the inputs. If any is bad, the phi is bad.
      bool bad = false;
      for (auto& state : states) {
        auto* node = state.locals[i];
        if (node->isBad()) {
          bad = true;
          out[i] = node;
          break;
        }
      }
      if (bad) {
        continue;
      }
      // Nothing is bad, proceed.
      Node* first = nullptr;
      for (auto& state : states) {
        if (!first) {
          first = out[i] = state.locals[i];
        } else if (state.locals[i] != first) {
          // We need to actually merge some stuff.
          if (!block) {
            block = addNode(Node::makeBlock());
            for (Index index = 0; index < numStates; index++) {
              auto* condition = states[index].condition;
              if (!condition->isBad()) {
                condition = addNode(Node::makeCond(block, index, condition));
              }
              block->addValue(condition);
            }
          }
          auto* phi = addNode(Node::makePhi(block, i));
          for (auto& state : states) {
            auto* value = expandFromI1(state.locals[i], nullptr);
            phi->addValue(value);
          }
          out[i] = phi;
          break;
        }
      }
    }
  }